

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateAdjustBaseSlots
          (Lowerer *this,Instr *instrInsert,RegOpnd *baseOpnd,JITTypeHolder initialType,
          JITTypeHolder finalType)

{
  LowererMD *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  JITType *pJVar4;
  JITTypeHandler *pJVar5;
  JITTypeHandler *pJVar6;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  HelperCallOpnd *newSrc;
  Instr *this_01;
  int local_6c;
  JITTypeHolder JStack_68;
  int oldCount;
  JITTypeHolder initialType_local;
  JITTypeHolder finalType_local;
  PropertyIndex local_3a;
  int local_38;
  PropertyIndex inlineSlotCapacity;
  int newCount;
  PropertyIndex newInlineSlotCapacity;
  
  JStack_68.t = initialType.t;
  initialType_local = finalType;
  pJVar4 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff98);
  pJVar5 = JITType::GetTypeHandler(pJVar4);
  pJVar4 = JITTypeHolderBase<void>::operator->(&initialType_local);
  pJVar6 = JITType::GetTypeHandler(pJVar4);
  bVar2 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(pJVar5,pJVar6);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2049,
                       "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(initialType->GetTypeHandler(), finalType->GetTypeHandler()))"
                       ,"Incompatible typeHandler transition?");
    if (!bVar2) goto LAB_00568e6c;
    *puVar7 = 0;
  }
  local_6c = 0;
  local_38 = 0;
  local_3a = 0;
  inlineSlotCapacity = 0;
  pJVar4 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff98);
  pJVar5 = JITType::GetTypeHandler(pJVar4);
  pJVar4 = JITTypeHolderBase<void>::operator->(&initialType_local);
  pJVar6 = JITType::GetTypeHandler(pJVar4);
  bVar2 = JITTypeHandler::NeedSlotAdjustment
                    (pJVar5,pJVar6,&local_6c,&local_38,&local_3a,&inlineSlotCapacity);
  if (bVar2) {
    if (local_38 <= (int)(uint)inlineSlotCapacity) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x205d,"(newCount > newInlineSlotCapacity)",
                         "newCount > newInlineSlotCapacity");
      if (!bVar3) {
LAB_00568e6c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    this_00 = &this->m_lowererMD;
    pIVar8 = IR::IntConstOpnd::New
                       ((long)(int)(local_38 - (uint)inlineSlotCapacity),TyInt32,this->m_func,false)
    ;
    LowererMD::LoadHelperArgument(this_00,instrInsert,&pIVar8->super_Opnd);
    pIVar8 = IR::IntConstOpnd::New((ulong)inlineSlotCapacity,TyUint16,this->m_func,false);
    LowererMD::LoadHelperArgument(this_00,instrInsert,&pIVar8->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,instrInsert,&baseOpnd->super_Opnd);
    newSrc = IR::HelperCallOpnd::New(HelperAdjustSlots,this->m_func);
    this_01 = IR::Instr::New(Call,this->m_func);
    IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(instrInsert,this_01);
    LowererMD::LowerCall(this_00,this_01,0);
  }
  return bVar2;
}

Assistant:

bool
Lowerer::GenerateAdjustBaseSlots(IR::Instr *instrInsert, IR::RegOpnd *baseOpnd, JITTypeHolder initialType, JITTypeHolder finalType)
{
    // Possibly allocate new slot capacity to accommodate a type transition.
    AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(initialType->GetTypeHandler(), finalType->GetTypeHandler()),
        "Incompatible typeHandler transition?");

    int oldCount = 0;
    int newCount = 0;
    Js::PropertyIndex inlineSlotCapacity = 0;
    Js::PropertyIndex newInlineSlotCapacity = 0;
    bool needSlotAdjustment =
        JITTypeHandler::NeedSlotAdjustment(initialType->GetTypeHandler(), finalType->GetTypeHandler(), &oldCount, &newCount, &inlineSlotCapacity, &newInlineSlotCapacity);

    if (!needSlotAdjustment)
    {
        return false;
    }

    // Call AdjustSlots using the new counts. Because AdjustSlots uses the "no dispose" flavor of alloc,
    // no implicit calls are possible, and we don't need an implicit call check and bailout.

    // CALL AdjustSlots, instance, newInlineSlotCapacity, newAuxSlotCapacity

    //3rd Param
    Assert(newCount > newInlineSlotCapacity);
    const int newAuxSlotCapacity = newCount - newInlineSlotCapacity;
    m_lowererMD.LoadHelperArgument(instrInsert, IR::IntConstOpnd::New(newAuxSlotCapacity, TyInt32, this->m_func));

    //2nd Param
    m_lowererMD.LoadHelperArgument(instrInsert, IR::IntConstOpnd::New(newInlineSlotCapacity, TyUint16, this->m_func));

    //1st Param (instance)
    m_lowererMD.LoadHelperArgument(instrInsert, baseOpnd);

    //CALL HelperAdjustSlots
    IR::Opnd *opnd = IR::HelperCallOpnd::New(IR::HelperAdjustSlots, this->m_func);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Call, this->m_func);
    instr->SetSrc1(opnd);
    instrInsert->InsertBefore(instr);
    m_lowererMD.LowerCall(instr, 0);

    return true;
}